

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_sol.h
# Opt level: O1

void __thiscall
ExampleSOLHandler::OnDblSuffix<mp::SuffixReader<double>>
          (ExampleSOLHandler *this,SuffixReader<double> *sr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ExampleModel *pEVar2;
  pointer pcVar3;
  int iVar4;
  mapped_type *this_00;
  pair<int,_double> pVar5;
  key_type local_50;
  
  iVar4 = (sr->si_).kind_;
  pEVar2 = this->mdl_;
  paVar1 = &local_50.first.field_2;
  pcVar3 = (sr->si_).name_._M_dataplus._M_p;
  local_50.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + (sr->si_).name_._M_string_length);
  local_50.second = iVar4;
  this_00 = std::
            map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
            ::operator[](&pEVar2->suf_out_,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.first._M_dataplus._M_p,local_50.first.field_2._M_allocated_capacity + 1
                   );
  }
  while ((sr->super_SparseVecReader<double>).n_ != 0) {
    pVar5 = mp::VecReader<std::pair<int,_double>_>::ReadNext(&sr->super_SparseVecReader<double>);
    iVar4 = pVar5.first;
    if ((ulong)((long)(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= (ulong)(long)iVar4) {
      std::vector<double,_std::allocator<double>_>::resize(this_00,(long)(iVar4 + 1));
    }
    (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start[iVar4] = pVar5.second;
  }
  return;
}

Assistant:

void OnDblSuffix(SuffixReader& sr) {
    const auto& si = sr.SufInfo();
    int kind = si.Kind();
    const std::string& name = si.Name();
    assert(0 != (kind & 4));
    auto& suf_val = Model().suf_out_[std::make_pair(name, kind)];
    while (sr.Size()) {
      std::pair<int, double> val = sr.ReadNext();
      if (suf_val.size() <= val.first)
        suf_val.resize(val.first+1);
      suf_val[val.first] = val.second;
    }
  }